

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O0

void __thiscall
OpenMD::FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities
          (FluctuatingChargeConstraints *this)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  StuntDouble *pSVar5;
  vector<double,_std::allocator<double>_> *this_00;
  long in_RDI;
  RealType RVar6;
  RealType RVar7;
  SimInfo *pSVar8;
  int region_1;
  uint i_1;
  int region;
  RealType systemChargeMass;
  RealType flucqW;
  RealType molFlucQMass;
  RealType molCMom;
  RealType regionCMom;
  RealType systemCMom;
  RealType flucqP;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  FluctuatingChargeConstraints *in_stack_ffffffffffffff20;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff28;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  SimInfo *in_stack_ffffffffffffff40;
  uint local_94;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_ffffffffffffff20);
  }
  if ((*(byte *)(in_RDI + 9) & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    if ((*(byte *)(in_RDI + 10) & 1) != 0) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (double *)in_stack_ffffffffffffff20);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff18);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff18);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                 (int *)in_stack_ffffffffffffff20);
    }
    local_20 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffff40,(MoleculeIterator *)in_stack_ffffffffffffff38);
    while (local_20 != (Molecule *)0x0) {
      bVar1 = Molecule::constrainTotalCharge(local_20);
      if (!bVar1) {
        iVar2 = Molecule::getRegion((Molecule *)0x190786);
        local_28 = Molecule::beginFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffff40,
                              (iterator *)in_stack_ffffffffffffff38);
        while (local_28 != (Atom *)0x0) {
          RVar6 = StuntDouble::getFlucQVel((StuntDouble *)in_stack_ffffffffffffff20);
          RVar7 = Atom::getChargeMass(local_28);
          pSVar8 = (SimInfo *)(RVar6 * RVar7);
          if (((*(byte *)(in_RDI + 10) & 1) == 0) || (iVar2 < 0)) {
            Atom::getChargeMass(local_28);
          }
          else {
            in_stack_ffffffffffffff38 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x40);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)iVar2);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (in_stack_ffffffffffffff38,(long)*pvVar3);
            *pvVar4 = (double)pSVar8 + *pvVar4;
            RVar6 = Atom::getChargeMass(local_28);
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)iVar2);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                                (long)*pvVar3);
            *pvVar4 = RVar6 + *pvVar4;
            in_stack_ffffffffffffff40 = pSVar8;
          }
          local_28 = Molecule::nextFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff40,
                                (iterator *)in_stack_ffffffffffffff38);
        }
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffff40,(MoleculeIterator *)in_stack_ffffffffffffff38)
      ;
    }
    if ((*(byte *)(in_RDI + 10) & 1) != 0) {
      local_94 = 0;
      while( true ) {
        in_stack_ffffffffffffff30._M_current = (double *)(ulong)local_94;
        pSVar5 = (StuntDouble *)
                 std::vector<double,_std::allocator<double>_>::size
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40));
        if (pSVar5 <= in_stack_ffffffffffffff30._M_current) break;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x70),
                            (ulong)local_94);
        in_stack_ffffffffffffff28._M_current = (double *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x40),
                            (ulong)local_94);
        *pvVar4 = *pvVar4 / (double)in_stack_ffffffffffffff28._M_current;
        local_94 = local_94 + 1;
      }
    }
    local_20 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffff40,(MoleculeIterator *)in_stack_ffffffffffffff38);
    while (local_20 != (Molecule *)0x0) {
      bVar1 = Molecule::constrainTotalCharge(local_20);
      if (bVar1) {
        local_28 = Molecule::beginFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffff40,
                              (iterator *)in_stack_ffffffffffffff38);
        while (local_28 != (Atom *)0x0) {
          in_stack_ffffffffffffff20 =
               (FluctuatingChargeConstraints *)
               StuntDouble::getFlucQVel((StuntDouble *)in_stack_ffffffffffffff20);
          Atom::getChargeMass(local_28);
          Atom::getChargeMass(local_28);
          local_28 = Molecule::nextFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff40,
                                (iterator *)in_stack_ffffffffffffff38);
        }
        local_28 = Molecule::beginFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffff40,
                              (iterator *)in_stack_ffffffffffffff38);
        while (local_28 != (Atom *)0x0) {
          StuntDouble::getFlucQVel((StuntDouble *)in_stack_ffffffffffffff20);
          StuntDouble::setFlucQVel
                    ((StuntDouble *)in_stack_ffffffffffffff30._M_current,
                     (RealType)in_stack_ffffffffffffff28._M_current);
          local_28 = Molecule::nextFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff40,
                                (iterator *)in_stack_ffffffffffffff38);
        }
      }
      else {
        iVar2 = Molecule::getRegion((Molecule *)0x190b82);
        if (((*(byte *)(in_RDI + 10) & 1) == 0) || (iVar2 < 0)) {
          local_28 = Molecule::beginFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff40,
                                (iterator *)in_stack_ffffffffffffff38);
          while (local_28 != (Atom *)0x0) {
            StuntDouble::getFlucQVel((StuntDouble *)in_stack_ffffffffffffff20);
            StuntDouble::setFlucQVel
                      ((StuntDouble *)in_stack_ffffffffffffff30._M_current,
                       (RealType)in_stack_ffffffffffffff28._M_current);
            local_28 = Molecule::nextFluctuatingCharge
                                 ((Molecule *)in_stack_ffffffffffffff40,
                                  (iterator *)in_stack_ffffffffffffff38);
          }
        }
        else {
          this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x40);
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)iVar2);
          std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar3);
          local_28 = Molecule::beginFluctuatingCharge
                               ((Molecule *)in_stack_ffffffffffffff40,
                                (iterator *)in_stack_ffffffffffffff38);
          while (local_28 != (Atom *)0x0) {
            StuntDouble::getFlucQVel((StuntDouble *)in_stack_ffffffffffffff20);
            StuntDouble::setFlucQVel
                      ((StuntDouble *)in_stack_ffffffffffffff30._M_current,
                       (RealType)in_stack_ffffffffffffff28._M_current);
            local_28 = Molecule::nextFluctuatingCharge
                                 ((Molecule *)in_stack_ffffffffffffff40,
                                  (iterator *)in_stack_ffffffffffffff38);
          }
        }
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffff40,(MoleculeIterator *)in_stack_ffffffffffffff38)
      ;
    }
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::applyConstraintsOnChargeVelocities() {
    if (!initialized_) initialize();
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;

    RealType flucqP, systemCMom, regionCMom, molCMom, molFlucQMass, flucqW;
    RealType systemChargeMass;

    // accumulate the system fluctuating charge velocities, but we have
    // separate constraints for any charges in defined regions and for
    // molecules with constrained charges:

    systemCMom       = 0.0;
    systemChargeMass = 0.0;
    if (constrainRegions_) {
      std::fill(regionCMom_.begin(), regionCMom_.end(), 0.0);
      std::fill(regionChargeMass_.begin(), regionChargeMass_.end(), 0);
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      if (!mol->constrainTotalCharge()) {
        int region = mol->getRegion();

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          flucqP = atom->getFlucQVel() * atom->getChargeMass();
          if (constrainRegions_ && region >= 0) {
            regionCMom_[regionKeys_[region]] += flucqP;
            regionChargeMass_[regionKeys_[region]] += atom->getChargeMass();
          } else {
            systemCMom += flucqP;
            systemChargeMass += atom->getChargeMass();
          }
        }
      }
    }

#ifdef IS_MPI
    // in parallel, we need to add up the contributions from all
    // processors:
    MPI_Allreduce(MPI_IN_PLACE, &systemCMom, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &systemChargeMass, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);

    if (constrainRegions_) {
      MPI_Allreduce(MPI_IN_PLACE, &regionCMom_[0], regionCMom_.size(),
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &regionChargeMass_[0],
                    regionChargeMass_.size(), MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
    }
#endif

    // divide by the total number of fluctuating charges:
    systemCMom /= systemChargeMass;

    // do the same in the regions:
    if (constrainRegions_) {
      for (unsigned int i = 0; i < regionCMom_.size(); ++i) {
        regionCMom_[i] /= regionChargeMass_[i];
      }
    }

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      molCMom      = 0.0;
      molFlucQMass = 0.0;

      if (mol->constrainTotalCharge()) {
        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          molCMom += atom->getFlucQVel() * atom->getChargeMass();
          molFlucQMass += atom->getChargeMass();
        }
        molCMom /= molFlucQMass;

        for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
             atom = mol->nextFluctuatingCharge(j)) {
          flucqW = atom->getFlucQVel() - molCMom;
          atom->setFlucQVel(flucqW);
        }
      } else {
        int region = mol->getRegion();

        regionCMom = 0.0;
        if (constrainRegions_ && region >= 0) {
          regionCMom = regionCMom_[regionKeys_[region]];

          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            flucqW = atom->getFlucQVel() - regionCMom;
            atom->setFlucQVel(flucqW);
          }
        } else {
          for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
               atom = mol->nextFluctuatingCharge(j)) {
            flucqW = atom->getFlucQVel() - systemCMom;
            atom->setFlucQVel(flucqW);
          }
        }
      }
    }
  }